

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Flow * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::visitMemorySize
          (Flow *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,MemorySize *curr)

{
  Name memory_00;
  address64_t x;
  Name NVar1;
  Literal local_a0;
  ModuleRunner *local_88;
  size_t sStack_80;
  long local_70;
  Memory *memory;
  size_t sStack_60;
  Address local_50;
  Address memorySize;
  undefined1 local_38 [8];
  MemoryInstanceInfo info;
  MemorySize *curr_local;
  ModuleRunnerBase<wasm::ModuleRunner> *this_local;
  
  memorySize.addr = *(address64_t *)(curr + 0x18);
  info.name.super_IString.str._M_str = (char *)curr;
  getMemoryInstanceInfo((MemoryInstanceInfo *)local_38,this,(Name)*(string_view *)(curr + 0x18));
  memory = (Memory *)info.instance;
  sStack_60 = info.name.super_IString.str._M_len;
  memory_00.super_IString.str._M_str = (char *)info.name.super_IString.str._M_len;
  memory_00.super_IString.str._M_len = (size_t)info.instance;
  local_50 = getMemorySize((ModuleRunnerBase<wasm::ModuleRunner> *)local_38,memory_00);
  local_88 = info.instance;
  sStack_80 = info.name.super_IString.str._M_len;
  NVar1.super_IString.str._M_str = (char *)info.instance;
  NVar1.super_IString.str._M_len = (size_t)*(Module **)((long)local_38 + 0x20);
  local_70 = ::wasm::Module::getMemory(NVar1);
  x = Address::operator_cast_to_unsigned_long(&local_50);
  wasm::Literal::makeFromInt64(&local_a0,x,(Type)*(uintptr_t *)(local_70 + 0x50));
  Flow::Flow(__return_storage_ptr__,&local_a0);
  ::wasm::Literal::~Literal(&local_a0);
  return __return_storage_ptr__;
}

Assistant:

Flow visitMemorySize(MemorySize* curr) {
    NOTE_ENTER("MemorySize");
    auto info = getMemoryInstanceInfo(curr->memory);
    auto memorySize = info.instance->getMemorySize(info.name);
    auto* memory = info.instance->wasm.getMemory(info.name);
    return Literal::makeFromInt64(memorySize, memory->indexType);
  }